

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplescene.cpp
# Opt level: O0

void __thiscall graphics101::SimpleScene::loadScene(SimpleScene *this,string *scene_path)

{
  GLint position_location;
  GLint normal_location;
  GLint texcoord_location;
  pointer pDVar1;
  element_type *peVar2;
  char *__to;
  char *__from;
  DrawablePtr *this_00;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  graphics101 local_140 [32];
  shared_ptr<graphics101::VertexAndFaceArrays> local_120;
  allocator local_109;
  string local_108 [32];
  graphics101 local_e8 [32];
  graphics101 local_c8 [55];
  allocator local_91;
  string local_90 [32];
  graphics101 local_70 [32];
  graphics101 local_50 [32];
  shared_ptr<graphics101::ShaderProgram> local_30;
  unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_> local_20;
  string *local_18;
  string *scene_path_local;
  SimpleScene *this_local;
  
  local_18 = scene_path;
  scene_path_local = (string *)this;
  Drawable::makePtr();
  this_00 = &this->m_drawable;
  std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::operator=
            (this_00,&local_20);
  std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::~unique_ptr
            (&local_20);
  ShaderProgram::makePtr();
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(this_00);
  std::shared_ptr<graphics101::ShaderProgram>::operator=(&pDVar1->program,&local_30);
  std::shared_ptr<graphics101::ShaderProgram>::~shared_ptr(&local_30);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(this_00);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"simplest.vs",&local_91);
  pathRelativeToFile(local_70,(string *)local_90,local_18);
  fileAsString(local_50,(string *)local_70);
  ShaderProgram::addShader(peVar2,0x8b31,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"simplest.fs",&local_109);
  pathRelativeToFile(local_e8,(string *)local_108,local_18);
  fileAsString(local_c8,(string *)local_e8);
  __from = (char *)0x8b30;
  ShaderProgram::addShader(peVar2,0x8b30,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  ShaderProgram::link(peVar2,__from,__to);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"triangle.obj",&local_161);
  pathRelativeToFile(local_140,(string *)local_160,local_18);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"vPos",&local_189);
  position_location = ShaderProgram::getAttribLocation(peVar2,(string *)local_188);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"vNormal",&local_1b1);
  normal_location = ShaderProgram::getAttribLocation(peVar2,(string *)local_1b0);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  peVar2 = std::
           __shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pDVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"vTexCoord",&local_1d9);
  texcoord_location = ShaderProgram::getAttribLocation(peVar2,(string *)local_1d8);
  vao::makeFromOBJPath
            ((vao *)&local_120,(string *)local_140,true,false,position_location,normal_location,
             texcoord_location);
  pDVar1 = std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::
           operator->(&this->m_drawable);
  std::shared_ptr<graphics101::VertexAndFaceArrays>::operator=(&pDVar1->vao,&local_120);
  std::shared_ptr<graphics101::VertexAndFaceArrays>::~shared_ptr(&local_120);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (*gl3wProcs.ptr[0x35])(0x3f800000,0);
  return;
}

Assistant:

void SimpleScene::loadScene( const std::string& scene_path ) {
    
    m_drawable = Drawable::makePtr();
    
    // Make a program.
    // Everyone else expects it to have been created so we can get binding locations.
    m_drawable->program = ShaderProgram::makePtr();
    m_drawable->program->addShader( GL_VERTEX_SHADER, fileAsString( pathRelativeToFile( "simplest.vs", scene_path ) ) );
    m_drawable->program->addShader( GL_FRAGMENT_SHADER, fileAsString( pathRelativeToFile( "simplest.fs", scene_path ) ) );
    m_drawable->program->link();
    
    // Demonstration of setting a uniform programmatically.
    // m_drawable->program->setUniform( "uColor", vec3( 1.0, 1.0, 0.0 ) );
    
    m_drawable->vao = vao::makeFromOBJPath(
        pathRelativeToFile( "triangle.obj", scene_path ),
        // Create normals if needed.
        true,
        // Don't normalize.
        false,
        m_drawable->program->getAttribLocation( "vPos" ),
        m_drawable->program->getAttribLocation( "vNormal" ),
        m_drawable->program->getAttribLocation( "vTexCoord" )
        );
    
    // Finally, set the background color.
    glClearColor( 1.0, 0.0, 0.0, 1.0 );
}